

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O0

int sunCompareTimes(void *l,void *r)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  SUNHashMapKeyValue right;
  SUNHashMapKeyValue left;
  double right_max;
  double left_max;
  void *r_local;
  void *l_local;
  undefined4 local_4;
  
  lVar3 = *l;
  lVar4 = *r;
  if ((lVar3 == 0) && (lVar4 == 0)) {
    local_4 = 0;
  }
  else if (lVar3 == 0) {
    local_4 = 1;
  }
  else if (lVar4 == 0) {
    local_4 = -1;
  }
  else {
    dVar1 = *(double *)(*(long *)(lVar3 + 8) + 0x18);
    dVar2 = *(double *)(*(long *)(lVar4 + 8) + 0x18);
    if (dVar2 <= dVar1) {
      if (dVar1 <= dVar2) {
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int sunCompareTimes(const void* l, const void* r)
{
  double left_max;
  double right_max;

  const SUNHashMapKeyValue left  = *((const SUNHashMapKeyValue*)l);
  const SUNHashMapKeyValue right = *((const SUNHashMapKeyValue*)r);

  if (left == NULL && right == NULL) { return 0; }
  if (left == NULL) { return 1; }
  if (right == NULL) { return -1; }

  left_max  = ((sunTimerStruct*)left->value)->maximum;
  right_max = ((sunTimerStruct*)right->value)->maximum;

  if (left_max < right_max) { return 1; }
  if (left_max > right_max) { return -1; }

  return 0;
}